

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall MsFlash50::MsFlash50(MsFlash50 *this,ByteVector *data)

{
  uint32_t uVar1;
  const_reference pvVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  region local_7c;
  int local_60;
  int i_1;
  extra local_50;
  int local_24;
  uint local_20;
  int i;
  int regioncount;
  int extracount;
  ByteVector *data_local;
  MsFlash50 *this_local;
  
  _regioncount = data;
  data_local = (ByteVector *)this;
  std::vector<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>::vector(&this->_extralist);
  std::vector<MsFlash50::region,_std::allocator<MsFlash50::region>_>::vector(&this->_regionlist);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](_regioncount,8);
  uVar1 = get32le<unsigned_char_const*>(pvVar2);
  i = uVar1 >> 4;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](_regioncount,0xc);
  uVar1 = get32le<unsigned_char_const*>(pvVar2);
  local_20 = uVar1 / 0x1c;
  for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (_regioncount,(long)(local_24 * 0x10 + 0x10));
    extra::extra(&local_50,pvVar2);
    std::vector<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>::push_back
              (&this->_extralist,&local_50);
    extra::~extra(&local_50);
  }
  for (local_60 = 0; local_60 < (int)local_20; local_60 = local_60 + 1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (_regioncount,(long)(i * 0x10 + 0x10 + local_60 * 0x1c));
    region::region(&local_7c,pvVar2);
    std::vector<MsFlash50::region,_std::allocator<MsFlash50::region>_>::push_back
              (&this->_regionlist,&local_7c);
  }
  if (g_verbose != 0) {
    printf("MSFLSH50\n");
    iVar3 = std::vector<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>::begin
                      (&this->_extralist);
    iVar4 = std::vector<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>::end(&this->_extralist)
    ;
    std::
    for_each<__gnu_cxx::__normal_iterator<MsFlash50::extra*,std::vector<MsFlash50::extra,std::allocator<MsFlash50::extra>>>,MsFlash50::__normal_iterator(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(MsFlash50::extra_const&)_1_>
              (iVar3._M_current,iVar4._M_current);
    iVar5 = std::vector<MsFlash50::region,_std::allocator<MsFlash50::region>_>::begin
                      (&this->_regionlist);
    iVar6 = std::vector<MsFlash50::region,_std::allocator<MsFlash50::region>_>::end
                      (&this->_regionlist);
    std::
    for_each<__gnu_cxx::__normal_iterator<MsFlash50::region*,std::vector<MsFlash50::region,std::allocator<MsFlash50::region>>>,MsFlash50::__normal_iterator(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(MsFlash50::region_const&)_1_>
              (iVar5._M_current,iVar6._M_current);
  }
  return;
}

Assistant:

MsFlash50(const ByteVector& data)
    {
        int extracount= get32le(&data[8])/0x10;
        int regioncount= get32le(&data[12])/0x1C;

        for (int i=0 ; i<extracount ; i++)
            _extralist.push_back(extra(&data[16+16*i]));
        for (int i=0 ; i<regioncount ; i++)
            _regionlist.push_back(region(&data[16+16*extracount+0x1c*i]));

        if (g_verbose) {
            printf("MSFLSH50\n");
            std::for_each(_extralist.begin(), _extralist.end(), [](const extra& e) { e.print(); });
            std::for_each(_regionlist.begin(), _regionlist.end(), [](const region& r) { r.print(); });
        }
    }